

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.h
# Opt level: O3

void __thiscall Dyndeps::~Dyndeps(Dyndeps *this)

{
  pointer ppNVar1;
  
  ppNVar1 = (this->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar1 != (pointer)0x0) {
    operator_delete(ppNVar1,(long)(this->implicit_outputs_).
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppNVar1);
  }
  ppNVar1 = (this->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar1 != (pointer)0x0) {
    operator_delete(ppNVar1,(long)(this->implicit_inputs_).
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppNVar1);
    return;
  }
  return;
}

Assistant:

Dyndeps() : used_(false), restat_(false) {}